

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsoncpp.cpp
# Opt level: O0

void __thiscall Json::StyledWriter::writeCommentBeforeValue(StyledWriter *this,Value *root)

{
  bool bVar1;
  reference pcVar2;
  Value *in_RSI;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_RDI;
  const_iterator iter;
  string normalizedComment;
  undefined7 in_stack_ffffffffffffff68;
  undefined1 in_stack_ffffffffffffff6f;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_00;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_ffffffffffffff80;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_68;
  CommentPlacement in_stack_ffffffffffffffa4;
  Value *in_stack_ffffffffffffffa8;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_50;
  string *in_stack_ffffffffffffffb8;
  string local_30 [48];
  
  bVar1 = Value::hasComment(in_RSI,commentBefore);
  if (bVar1) {
    std::__cxx11::string::operator+=((string *)(in_RDI + 4),"\n");
    writeIndent((StyledWriter *)in_stack_ffffffffffffff80._M_current);
    this_00 = &local_50;
    Value::getComment_abi_cxx11_(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa4);
    normalizeEOL(in_stack_ffffffffffffffb8);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::begin();
    __gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>::__normal_iterator<char*>
              (this_00,(__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)CONCAT17(in_stack_ffffffffffffff6f,in_stack_ffffffffffffff68));
    while( true ) {
      std::__cxx11::string::end();
      bVar1 = __gnu_cxx::operator!=
                        (this_00,(__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  *)CONCAT17(in_stack_ffffffffffffff6f,in_stack_ffffffffffffff68));
      if (!bVar1) break;
      pcVar2 = __gnu_cxx::
               __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::operator*(&local_68);
      std::__cxx11::string::operator+=((string *)(in_RDI + 4),*pcVar2);
      pcVar2 = __gnu_cxx::
               __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::operator*(&local_68);
      in_stack_ffffffffffffff6f = false;
      if (*pcVar2 == '\n') {
        in_stack_ffffffffffffff80 =
             __gnu_cxx::
             __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::operator+(in_RDI,(difference_type)this_00);
        pcVar2 = __gnu_cxx::
                 __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::operator*((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)&stack0xffffffffffffff80);
        in_stack_ffffffffffffff6f = *pcVar2 == '/';
      }
      if ((bool)in_stack_ffffffffffffff6f != false) {
        writeIndent((StyledWriter *)in_stack_ffffffffffffff80._M_current);
      }
      __gnu_cxx::
      __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator++(&local_68);
    }
    std::__cxx11::string::operator+=((string *)(in_RDI + 4),"\n");
    std::__cxx11::string::~string(local_30);
  }
  return;
}

Assistant:

void StyledWriter::writeCommentBeforeValue(const Value& root) {
  if (!root.hasComment(commentBefore))
    return;

  document_ += "\n";
  writeIndent();
  std::string normalizedComment = normalizeEOL(root.getComment(commentBefore));
  std::string::const_iterator iter = normalizedComment.begin();
  while (iter != normalizedComment.end()) {
    document_ += *iter;
    if (*iter == '\n' && *(iter + 1) == '/')
      writeIndent();
    ++iter;
  }

  // Comments are stripped of newlines, so add one here
  document_ += "\n";
}